

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall
DWallScrollInterpolation::DWallScrollInterpolation
          (DWallScrollInterpolation *this,side_t *_side,int _part)

{
  DObject::DObject((DObject *)this);
  (this->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).refcount = 0;
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0070f100;
  this->side = _side;
  this->part = _part;
  this->oldx = _side->textures[_part].xOffset;
  this->oldy = _side->textures[_part].yOffset;
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DWallScrollInterpolation::DWallScrollInterpolation(side_t *_side, int _part)
{
	side = _side;
	part = _part;
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}